

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O3

Vec_Int_t * Abc_NtkRetimeCollectLatchValues(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  int *__ptr;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  iVar6 = pNtk->nObjCounts[8];
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = __ptr;
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar8];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 8)) {
        lVar3 = *(long *)((long)pvVar2 + 0x38);
        uVar1 = pVVar4->nSize;
        if (uVar1 == pVVar4->nCap) {
          if ((int)uVar1 < 0x10) {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc(0x40);
            }
            else {
              __ptr = (int *)realloc(__ptr,0x40);
            }
            pVVar4->pArray = __ptr;
            iVar6 = 0x10;
            if (__ptr == (int *)0x0) {
LAB_004d3876:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr == (int *)0x0) {
              __ptr = (int *)malloc((ulong)uVar1 * 8);
            }
            else {
              __ptr = (int *)realloc(__ptr,(ulong)uVar1 * 8);
            }
            pVVar4->pArray = __ptr;
            if (__ptr == (int *)0x0) goto LAB_004d3876;
            iVar6 = uVar1 * 2;
          }
          pVVar4->nCap = iVar6;
        }
        pVVar4->nSize = uVar1 + 1;
        __ptr[(int)uVar1] = (uint)(lVar3 == 2);
        pVVar7 = pNtk->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar7->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_NtkRetimeCollectLatchValues( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vValues;
    Abc_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            Vec_IntPush( vValues, Abc_LatchIsInit1(pObj) );
    return vValues;
}